

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O1

Shader * __thiscall xe::ri::List::allocItem<xe::ri::Shader>(List *this)

{
  Shader *pSVar1;
  Shader *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pSVar1 = (Shader *)operator_new(0x78);
  *(undefined8 *)&(pSVar1->super_Item).m_type = 0x600000005;
  (pSVar1->super_Item)._vptr_Item = (_func_int **)&PTR__Shader_0011ba28;
  pSVar1->compileStatus = false;
  (pSVar1->source).super_Item.m_type = TYPE_SHADERSOURCE;
  (pSVar1->source).super_Item._vptr_Item = (_func_int **)&PTR__ShaderSource_0011ba60;
  (pSVar1->source).source._M_dataplus._M_p = (pointer)&(pSVar1->source).source.field_2;
  (pSVar1->source).source._M_string_length = 0;
  (pSVar1->source).source.field_2._M_local_buf[0] = '\0';
  (pSVar1->infoLog).super_Item.m_type = TYPE_INFOLOG;
  (pSVar1->infoLog).super_Item._vptr_Item = (_func_int **)&PTR__InfoLog_0011b9f0;
  (pSVar1->infoLog).log._M_dataplus._M_p = (pointer)&(pSVar1->infoLog).log.field_2;
  (pSVar1->infoLog).log._M_string_length = 0;
  (pSVar1->infoLog).log.field_2._M_local_buf[0] = '\0';
  local_18 = pSVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pSVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}